

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O0

uint sstep(re_guts *g,sopno start,sopno stop,uint bef,int ch,uint aft)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  long i;
  sopno look;
  sopno sStack_48;
  uint here;
  sopno pc;
  sop s;
  cset *cs;
  uint aft_local;
  int ch_local;
  uint bef_local;
  sopno stop_local;
  sopno start_local;
  re_guts *g_local;
  
  look._4_4_ = 1 << ((byte)start & 0x1f);
  sStack_48 = start;
  cs._4_4_ = aft;
  do {
    if (sStack_48 == stop) {
      return cs._4_4_;
    }
    uVar1 = g->strip[sStack_48];
    uVar3 = (uint)uVar1 & 0x7c000000;
    if (uVar3 == 0x4000000) {
      if (sStack_48 != stop + -1) {
        __assert_fail("pc == stop-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x344,"unsigned int sstep()");
      }
    }
    else {
      bVar2 = (byte)uVar1;
      if (uVar3 == 0x8000000) {
        if ((0x7f < ch) && (ch == (char)bVar2)) {
          __assert_fail("!NONCHAR(ch) || ch != (char)OPND(s)",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0x348,"unsigned int sstep()");
        }
        if (ch == (char)bVar2) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if (uVar3 == 0xc000000) {
        if ((ch == 0x81) || (ch == 0x83)) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if (uVar3 == 0x10000000) {
        if ((ch == 0x82) || (ch == 0x83)) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if (uVar3 == 0x14000000) {
        if (ch < 0x80) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if (uVar3 == 0x18000000) {
        if ((ch < 0x80) &&
           ((g->sets[uVar1 & 0x3ffffff].ptr[ch & 0xff] & g->sets[uVar1 & 0x3ffffff].mask) != 0)) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if ((uVar3 == 0x1c000000) || (uVar3 == 0x20000000)) {
        cs._4_4_ = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
      }
      else if (uVar3 == 0x24000000) {
        cs._4_4_ = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
      }
      else if (uVar3 == 0x28000000) {
        uVar3 = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
        cs._4_4_ = (uVar3 & look._4_4_) >> (bVar2 & 0x1f) | uVar3;
        if (((uVar3 & look._4_4_ >> (bVar2 & 0x1f)) == 0) &&
           ((cs._4_4_ & look._4_4_ >> (bVar2 & 0x1f)) != 0)) {
          sStack_48 = sStack_48 - ((uVar1 & 0x3ffffff) + 1);
          look._4_4_ = 1 << ((byte)sStack_48 & 0x1f);
        }
      }
      else if (uVar3 == 0x2c000000) {
        uVar3 = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
        cs._4_4_ = (uVar3 & look._4_4_) << (bVar2 & 0x1f) | uVar3;
      }
      else if (uVar3 == 0x30000000) {
        cs._4_4_ = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
      }
      else if ((uVar3 == 0x34000000) || (uVar3 == 0x38000000)) {
        cs._4_4_ = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
      }
      else if (uVar3 == 0x3c000000) {
        uVar3 = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
        if ((g->strip[sStack_48 + (uVar1 & 0x3ffffff)] & 0x7c000000U) != 0x44000000) {
          __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,899,"unsigned int sstep()");
        }
        cs._4_4_ = (uVar3 & look._4_4_) << (bVar2 & 0x1f) | uVar3;
      }
      else if (uVar3 == 0x40000000) {
        if ((cs._4_4_ & look._4_4_) != 0) {
          i = 1;
          while (uVar1 = g->strip[sStack_48 + i], (uVar1 & 0x7c000000) != 0x48000000) {
            if ((uVar1 & 0x7c000000) != 0x44000000) {
              __assert_fail("OP(s) == OOR2",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                            ,0x38b,"unsigned int sstep()");
            }
            i = (uVar1 & 0x3ffffff) + i;
          }
          cs._4_4_ = (cs._4_4_ & look._4_4_) << ((byte)i & 0x1f) | cs._4_4_;
        }
      }
      else if (uVar3 == 0x44000000) {
        cs._4_4_ = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
        if ((g->strip[sStack_48 + (uVar1 & 0x3ffffff)] & 0x7c000000U) != 0x48000000) {
          if ((g->strip[sStack_48 + (uVar1 & 0x3ffffff)] & 0x7c000000U) != 0x44000000) {
            __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0x392,"unsigned int sstep()");
          }
          cs._4_4_ = (cs._4_4_ & look._4_4_) << (bVar2 & 0x1f) | cs._4_4_;
        }
      }
      else if (uVar3 == 0x48000000) {
        cs._4_4_ = (cs._4_4_ & look._4_4_) << 1 | cs._4_4_;
      }
      else if (uVar3 == 0x4c000000) {
        if (ch == 0x85) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if (uVar3 == 0x50000000) {
        if (ch == 0x86) {
          cs._4_4_ = (bef & look._4_4_) << 1 | cs._4_4_;
        }
      }
      else if (nope == 0) {
        __assert_fail("nope",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x39a,"unsigned int sstep()");
      }
    }
    sStack_48 = sStack_48 + 1;
    look._4_4_ = look._4_4_ << 1;
  } while( true );
}

Assistant:

static states
step(g, start, stop, bef, ch, aft)
struct re_guts *g;
sopno start;			/* start state within strip */
sopno stop;			/* state after stop state within strip */
states bef;		/* states reachable before */
int ch;				/* character or NONCHAR code */
states aft;		/* states already known reachable after */
{
	cset *cs;
	sop s;
	sopno pc;
	onestate here;		/* note, macros know this name */
	sopno look;
	long i;

	for (pc = start, INIT(here, pc); pc != stop; pc++, INC(here)) {
		s = g->strip[pc];
		switch (OP(s)) {
		case OEND:
			assert(pc == stop-1);
			break;
		case OCHAR:
			/* only characters can match */
			assert(!NONCHAR(ch) || ch != (char)OPND(s));
			if (ch == (char)OPND(s))
				FWD(aft, bef, 1);
			break;
		case OBOL:
			if (ch == BOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OEOL:
			if (ch == EOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OBOW:
			if (ch == BOW)
				FWD(aft, bef, 1);
			break;
		case OEOW:
			if (ch == EOW)
				FWD(aft, bef, 1);
			break;
		case OANY:
			if (!NONCHAR(ch))
				FWD(aft, bef, 1);
			break;
		case OANYOF:
			cs = &g->sets[OPND(s)];
			if (!NONCHAR(ch) && CHIN(cs, ch))
				FWD(aft, bef, 1);
			break;
		case OBACK_:		/* ignored here */
		case O_BACK:
			FWD(aft, aft, 1);
			break;
		case OPLUS_:		/* forward, this is just an empty */
			FWD(aft, aft, 1);
			break;
		case O_PLUS:		/* both forward and back */
			FWD(aft, aft, 1);
			i = ISSETBACK(aft, OPND(s));
			BACK(aft, aft, OPND(s));
			if (!i && ISSETBACK(aft, OPND(s))) {
				/* oho, must reconsider loop body */
				pc -= OPND(s) + 1;
				INIT(here, pc);
			}
			break;
		case OQUEST_:		/* two branches, both forward */
			FWD(aft, aft, 1);
			FWD(aft, aft, OPND(s));
			break;
		case O_QUEST:		/* just an empty */
			FWD(aft, aft, 1);
			break;
		case OLPAREN:		/* not significant here */
		case ORPAREN:
			FWD(aft, aft, 1);
			break;
		case OCH_:		/* mark the first two branches */
			FWD(aft, aft, 1);
			assert(OP(g->strip[pc+OPND(s)]) == OOR2);
			FWD(aft, aft, OPND(s));
			break;
		case OOR1:		/* done a branch, find the O_CH */
			if (ISSTATEIN(aft, here)) {
				for (look = 1;
						OP(s = g->strip[pc+look]) != O_CH;
						look += OPND(s))
					assert(OP(s) == OOR2);
				FWD(aft, aft, look);
			}
			break;
		case OOR2:		/* propagate OCH_'s marking */
			FWD(aft, aft, 1);
			if (OP(g->strip[pc+OPND(s)]) != O_CH) {
				assert(OP(g->strip[pc+OPND(s)]) == OOR2);
				FWD(aft, aft, OPND(s));
			}
			break;
		case O_CH:		/* just empty */
			FWD(aft, aft, 1);
			break;
		default:		/* ooooops... */
			assert(nope);
			break;
		}
	}

	return(aft);
}